

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

DWORD GetModuleFileNameW(HMODULE hModule,LPWSTR lpFileName,DWORD nSize)

{
  LPCWSTR lpString;
  BOOL BVar1;
  DWORD DVar2;
  MODSTRUCT *pMVar3;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_001cedbc;
  LockModuleList();
  wcscpy_s((char16_t_conflict *)lpFileName,(ulong)nSize,(char16_t_conflict *)L"");
  if (hModule == (HMODULE)0x0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cedbc;
    pMVar3 = &exe_module;
LAB_001ced3a:
    lpString = pMVar3->lib_name;
    if (lpString == (LPCWSTR)0x0) {
      DVar2 = 0x54f;
      goto joined_r0x001ced7a;
    }
    DVar2 = lstrlenW(lpString);
    if ((int)nSize <= (int)DVar2) {
      DVar2 = 0x7a;
      goto joined_r0x001ced7a;
    }
    wcscpy_s((char16_t_conflict *)lpFileName,(ulong)nSize,(char16_t_conflict *)lpString);
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cedbc;
  }
  else {
    BVar1 = LOADValidateModule((MODSTRUCT *)hModule);
    if (BVar1 != 0) {
      pMVar3 = (MODSTRUCT *)hModule;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cedbc;
      goto LAB_001ced3a;
    }
    DVar2 = 6;
joined_r0x001ced7a:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cedbc;
    SetLastError(DVar2);
    DVar2 = 0;
  }
  UnlockModuleList();
  if (PAL_InitializeChakraCoreCalled != false) {
    return DVar2;
  }
LAB_001cedbc:
  abort();
}

Assistant:

DWORD
PALAPI
GetModuleFileNameW(
    IN HMODULE hModule,
    OUT LPWSTR lpFileName,
    IN DWORD nSize)
{
    INT name_length;
    DWORD retval = 0;
    LPWSTR wide_name = nullptr;

    PERF_ENTRY(GetModuleFileNameW);
    ENTRY("GetModuleFileNameW (hModule=%p, lpFileName=%p, nSize=%u)\n",
          hModule, lpFileName, nSize);

    LockModuleList();

    wcscpy_s(lpFileName, nSize, W(""));

    if (hModule && !LOADValidateModule((MODSTRUCT *)hModule))
    {
        TRACE("Can't find name for invalid module handle %p\n", hModule);
        SetLastError(ERROR_INVALID_HANDLE);
        goto done;
    }
    wide_name = LOADGetModuleFileName((MODSTRUCT *)hModule);

    if (!wide_name)
    {
        TRACE("Can't find name for valid module handle %p\n", hModule);
        SetLastError(ERROR_INTERNAL_ERROR);
        goto done;
    }

    /* Copy module name into supplied buffer */

    name_length = lstrlenW(wide_name);
    if (name_length >= (INT)nSize)
    {
        TRACE("Buffer too small (%u) to copy module's file name (%u).\n", nSize, name_length);
        SetLastError(ERROR_INSUFFICIENT_BUFFER);
        goto done;
    }

    wcscpy_s(lpFileName, nSize, wide_name);

    TRACE("file name of module %p is %S\n", hModule, lpFileName);
    retval = name_length;
done:
    UnlockModuleList();
    LOGEXIT("GetModuleFileNameW returns DWORD %u\n", retval);
    PERF_EXIT(GetModuleFileNameW);
    return retval;
}